

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

void __thiscall Matrix<double>::initialize(Matrix<double> *this,double beg,double end)

{
  time_t tVar1;
  uint j;
  ulong uVar2;
  uint i;
  ulong uVar3;
  double dVar4;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  for (uVar3 = 0; uVar3 < (this->m_shape).n_row; uVar3 = uVar3 + 1) {
    for (uVar2 = 0; uVar2 < (this->m_shape).n_col; uVar2 = uVar2 + 1) {
      dVar4 = get_random<double>(beg,end);
      *(double *)
       (*(long *)&(this->m_elems).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar2 * 8) = dVar4;
    }
  }
  return;
}

Assistant:

void Matrix<T>::initialize(T beg, T end){
    srand(time(0));

    for(unsigned i=0;i<m_shape.n_row;++i){
        for(unsigned j=0;j<m_shape.n_col;++j)
            m_elems[i][j]=get_random<T>(beg, end);
    }
}